

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChMathematics.cpp
# Opt level: O3

double chrono::ChRandom(void)

{
  long lVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  
  lVar3 = ((long)(CH_PAseed ^ 0x75bd924) / 0x1f31d) * -0xb14;
  lVar1 = ((long)(CH_PAseed ^ 0x75bd924) % 0x1f31d) * 0x41a7;
  uVar2 = lVar1 + lVar3;
  uVar4 = lVar1 + 0x7fffffff + lVar3;
  if (-1 < (long)uVar2) {
    uVar4 = uVar2;
  }
  CH_PAseed = uVar4 ^ 0x75bd924;
  return (double)(long)uVar4 * 4.656612875245797e-10;
}

Assistant:

double ChRandom() {
    long k;
    double ans;
    CH_PAseed ^= MASK;
    k = (CH_PAseed) / IQ;
    CH_PAseed = IA * (CH_PAseed - k * IQ) - IR * k;
    if (CH_PAseed < 0)
        CH_PAseed += IM;
    ans = AM * (CH_PAseed);
    CH_PAseed ^= MASK;
    return ans;
}